

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O0

hugeint_t duckdb::BitwiseShiftLeftOperator::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t input,hugeint_t shift)

{
  ulong uVar1;
  undefined8 uVar2;
  int64_t in_RCX;
  uint64_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  hugeint_t hVar3;
  hugeint_t hVar4;
  hugeint_t hVar5;
  hugeint_t hVar6;
  hugeint_t hVar7;
  undefined1 auVar8 [16];
  hugeint_t in;
  hugeint_t in_00;
  hugeint_t max_value;
  hugeint_t max_shift;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  OutOfRangeException *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd88;
  OutOfRangeException *in_stack_fffffffffffffd90;
  allocator local_251;
  string local_250 [32];
  hugeint_t local_230;
  hugeint_t local_220;
  hugeint_t local_210;
  hugeint_t local_200;
  undefined1 local_1f0 [16];
  hugeint_t local_1e0;
  hugeint_t local_1d0;
  undefined1 local_1b9;
  uint64_t local_1b8;
  int64_t iStack_1b0;
  undefined1 local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  hugeint_t local_160;
  undefined1 local_149;
  uint64_t local_148;
  int64_t iStack_140;
  undefined1 local_138 [39];
  allocator local_111;
  string local_110 [32];
  hugeint_t local_f0;
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d0;
  undefined1 local_c8 [55];
  allocator local_91;
  string local_90 [32];
  hugeint_t local_70;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  hugeint_t local_20;
  hugeint_t local_10;
  
  local_30.lower = in_RDX;
  local_30.upper = in_RCX;
  local_20.lower = (uint64_t)in_RDI;
  local_20.upper = (int64_t)in_RSI;
  duckdb::hugeint_t::hugeint_t(&local_50,0x80);
  duckdb::hugeint_t::hugeint_t(&local_60,0);
  local_40 = (hugeint_t)duckdb::hugeint_t::operator+(&local_50,&local_60);
  duckdb::hugeint_t::hugeint_t(&local_70,0);
  uVar1 = duckdb::hugeint_t::operator<(&local_20,&local_70);
  if ((uVar1 & 1) != 0) {
    local_d9 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Cannot left-shift negative number %s",&local_91);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20.lower;
    pbStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20.upper
    ;
    hVar3.upper = local_20.lower;
    hVar3.lower = (uint64_t)local_c8;
    duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar3);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    local_d9 = 0;
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  duckdb::hugeint_t::hugeint_t(&local_f0,0);
  uVar1 = duckdb::hugeint_t::operator<(&local_30,&local_f0);
  if ((uVar1 & 1) == 0) {
    uVar1 = duckdb::hugeint_t::operator>=(&local_30,&local_40);
    if ((uVar1 & 1) == 0) {
      duckdb::hugeint_t::hugeint_t(&local_1d0,0);
      uVar1 = duckdb::hugeint_t::operator==(&local_30,&local_1d0);
      if ((uVar1 & 1) == 0) {
        duckdb::hugeint_t::hugeint_t(&local_200,1);
        local_220 = (hugeint_t)duckdb::hugeint_t::operator-(&local_40,&local_30);
        duckdb::hugeint_t::hugeint_t(&local_230,1);
        local_210 = (hugeint_t)duckdb::hugeint_t::operator-(&local_220,&local_230);
        local_1f0 = duckdb::hugeint_t::operator<<(&local_200,&local_210);
        in.upper = local_1f0._8_8_;
        in.lower = in.upper;
        local_1e0 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(local_1f0._0_8_,in);
        uVar1 = duckdb::hugeint_t::operator>=(&local_20,&local_1e0);
        if ((uVar1 & 1) != 0) {
          uVar2 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_250,"Overflow in left shift (%s << %s)",&local_251);
          hVar6.upper = local_20.lower;
          hVar6.lower = (uint64_t)&stack0xfffffffffffffd88;
          duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar6);
          hVar7.upper = local_30.lower;
          hVar7.lower = (uint64_t)&stack0xfffffffffffffd58;
          duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar7);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_20.upper,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_20.lower);
          __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException
                     );
        }
        auVar8 = duckdb::hugeint_t::operator<<(&local_20,&local_30);
        in_00.upper = auVar8._8_8_;
        in_00.lower = in_00.upper;
        local_10 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(auVar8._0_8_,in_00);
      }
      else {
        local_10.upper = local_20.upper;
        local_10.lower = local_20.lower;
      }
    }
    else {
      duckdb::hugeint_t::hugeint_t(&local_160,0);
      uVar1 = duckdb::hugeint_t::operator==(&local_20,&local_160);
      if ((uVar1 & 1) == 0) {
        local_1b9 = 1;
        uVar2 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"Left-shift value %s is out of range",&local_181);
        local_1b8 = local_30.lower;
        iStack_1b0 = local_30.upper;
        hVar5.upper = local_30.lower;
        hVar5.lower = (uint64_t)local_1a8;
        duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar5);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>
                  (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        local_1b9 = 0;
        __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
      }
      duckdb::hugeint_t::hugeint_t(&local_10,0);
    }
    return local_10;
  }
  local_149 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"Cannot left-shift by negative number %s",&local_111);
  local_148 = local_30.lower;
  iStack_140 = local_30.upper;
  hVar4.upper = local_30.lower;
  hVar4.lower = (uint64_t)local_138;
  duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar4);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  local_149 = 0;
  __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}